

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

void adios2sys::RegExpCompile::regtail(char *p,char *val)

{
  ushort uVar1;
  ulong uVar2;
  
  if (p != &regdummy) {
    do {
      uVar1 = *(ushort *)(p + 1) << 8 | *(ushort *)(p + 1) >> 8;
      if (uVar1 == 0) goto LAB_0071e1dc;
      uVar2 = -(ulong)uVar1;
      if (*p != '\a') {
        uVar2 = (ulong)uVar1;
      }
      p = p + uVar2;
    } while (p != &regdummy);
    p = &regdummy;
LAB_0071e1dc:
    uVar1 = (short)val - (short)p;
    if (*p == '\a') {
      uVar1 = (short)p - (short)val;
    }
    *(ushort *)(p + 1) = uVar1 << 8 | uVar1 >> 8;
  }
  return;
}

Assistant:

void RegExpCompile::regtail(char* p, const char* val)
{
  char* scan;
  char* temp;
  int offset;

  if (p == regdummyptr)
    return;

  // Find last node.
  scan = p;
  for (;;) {
    temp = regnext(scan);
    if (!temp)
      break;
    scan = temp;
  }

  if (OP(scan) == BACK)
    offset = int(scan - val);
  else
    offset = int(val - scan);
  *(scan + 1) = static_cast<char>((offset >> 8) & 0377);
  *(scan + 2) = static_cast<char>(offset & 0377);
}